

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void init_server_web(void)

{
  int iVar1;
  char *__s;
  sockaddr_in web_addr;
  
  epoll_fd = epoll_create1(0);
  if (epoll_fd == -1) {
    __s = "epoll_create1";
  }
  else {
    event.events = 0x2001;
    web_sock = socket(2,1,0);
    if (web_sock == -1) {
      __s = "Socket";
    }
    else {
      web_addr.sin_family = 2;
      web_addr.sin_addr.s_addr = 0;
      web_addr.sin_port = (ushort)server_port << 8 | (ushort)server_port >> 8;
      iVar1 = bind(web_sock,(sockaddr *)&web_addr,0x10);
      if (iVar1 == -1) {
        __s = "Bind";
      }
      else {
        iVar1 = listen(web_sock,100);
        if (iVar1 == -1) {
          __s = "listen";
        }
        else {
          event.data.fd = web_sock;
          iVar1 = epoll_ctl(epoll_fd,1,web_sock,(epoll_event *)&event);
          if (iVar1 != -1) {
            return;
          }
          __s = "epoll_ctl";
        }
      }
    }
  }
  perror(__s);
  exit(1);
}

Assistant:

void init_server_web(){
    if((epoll_fd = epoll_create1(0)) == -1){
        perror("epoll_create1");
        exit(EXIT_FAILURE);
    }
    event.events = EPOLLIN | EPOLLRDHUP;
    web_sock = socket(AF_INET,SOCK_STREAM,0);
    if(web_sock == -1){
        perror("Socket");
        exit(EXIT_FAILURE);
    }
    struct sockaddr_in web_addr;
    web_addr.sin_family = AF_INET;
    web_addr.sin_addr.s_addr = INADDR_ANY;
    web_addr.sin_port = htons((uint16_t) server_port);

    if(bind(web_sock,(struct sockaddr *)&web_addr,sizeof(web_addr)) == -1){
        perror("Bind");
        exit(EXIT_FAILURE);
    }
    if(listen(web_sock,N) == -1){
        perror("listen");
        exit(EXIT_FAILURE);
    }
    event.data.fd = web_sock;
    if(epoll_ctl(epoll_fd, EPOLL_CTL_ADD, web_sock, &event)==-1){
        perror("epoll_ctl");
        exit(EXIT_FAILURE);
    }
}